

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  long in_RCX;
  undefined8 *extraout_RDX;
  uv_handle_t *unaff_RBX;
  undefined1 *puVar7;
  int in_R8D;
  undefined1 auStack_678 [16];
  sockaddr sStack_668;
  undefined2 uStack_658;
  undefined1 uStack_656;
  undefined5 uStack_655;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined6 uStack_610;
  undefined2 uStack_60a;
  undefined6 uStack_608;
  undefined8 uStack_602;
  undefined1 auStack_5f8 [216];
  undefined1 auStack_520 [320];
  ulong uStack_3e0;
  code *pcStack_3d8;
  undefined1 auStack_3d0 [16];
  sockaddr sStack_3c0;
  undefined1 auStack_3b0 [96];
  long lStack_350;
  undefined1 auStack_2d8 [216];
  code *pcStack_200;
  sockaddr sStack_1f0;
  undefined1 auStack_1e0 [216];
  code *pcStack_108;
  undefined1 auStack_100 [216];
  uv_handle_t *puStack_28;
  
  if (suggested_size < 0x10001) {
    buf->base = alloc_cb::slab;
    buf->len = 0x10000;
    return;
  }
  alloc_cb_cold_1();
  if ((long)suggested_size < 0) {
    recv_cb_cold_7();
LAB_00189804:
    recv_cb_cold_1();
LAB_00189809:
    recv_cb_cold_5();
LAB_0018980e:
    recv_cb_cold_2();
LAB_00189813:
    recv_cb_cold_3();
LAB_00189818:
    recv_cb_cold_4();
  }
  else {
    if (suggested_size != 0) {
      if (in_R8D != 0) goto LAB_00189804;
      if (in_RCX == 0) goto LAB_00189809;
      if (suggested_size != 4) goto LAB_0018980e;
      if (*(int *)*extraout_RDX != 0x474e4950) goto LAB_00189813;
      iVar1 = uv_udp_recv_stop();
      unaff_RBX = handle;
      if (iVar1 == 0) {
        uv_close(handle,close_cb);
        return;
      }
      goto LAB_00189818;
    }
    if (in_RCX == 0) {
      return;
    }
  }
  iVar1 = (int)suggested_size;
  recv_cb_cold_6();
  if (in_RCX == 0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close(*(undefined8 *)(in_RCX + 0x40),close_cb);
    return;
  }
  send_cb_cold_1();
  pcStack_108 = (code *)0x18985e;
  puStack_28 = unaff_RBX;
  uVar2 = create_udp_socket();
  pcStack_108 = (code *)0x189865;
  uVar3 = create_udp_socket();
  uVar5 = (ulong)uVar3;
  pcStack_108 = (code *)0x18986c;
  uVar4 = uv_default_loop();
  pcStack_108 = (code *)0x189877;
  iVar1 = uv_udp_init(uVar4,auStack_100);
  if (iVar1 == 0) {
    pcStack_108 = (code *)0x189889;
    iVar1 = uv_udp_open(auStack_100,uVar2);
    if (iVar1 != 0) goto LAB_0018990a;
    pcStack_108 = (code *)0x189897;
    iVar1 = uv_udp_open(auStack_100,uVar3);
    if (iVar1 != -0x10) goto LAB_0018990f;
    pcStack_108 = (code *)0x1898a3;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00189914;
    pcStack_108 = (code *)0x1898b1;
    uv_close(auStack_100,0);
    pcStack_108 = (code *)0x1898b6;
    uVar4 = uv_default_loop();
    pcStack_108 = (code *)0x1898c0;
    uv_run(uVar4,0);
    pcStack_108 = (code *)0x1898c5;
    uVar5 = uv_default_loop();
    pcStack_108 = (code *)0x1898d9;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_108 = (code *)0x1898e3;
    uv_run(uVar5,0);
    pcStack_108 = (code *)0x1898e8;
    uVar4 = uv_default_loop();
    pcStack_108 = (code *)0x1898f0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_108 = (code *)0x1898f9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x18990a;
    run_test_udp_open_twice_cold_1();
LAB_0018990a:
    pcStack_108 = (code *)0x18990f;
    run_test_udp_open_twice_cold_2();
LAB_0018990f:
    pcStack_108 = (code *)0x189914;
    run_test_udp_open_twice_cold_3();
LAB_00189914:
    pcStack_108 = (code *)0x189919;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_108 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_200 = (code *)0x18993c;
  pcStack_108 = (code *)uVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1f0);
  if (iVar1 == 0) {
    pcStack_200 = (code *)0x189949;
    uVar3 = create_udp_socket();
    uVar5 = (ulong)uVar3;
    pcStack_200 = (code *)0x18995c;
    iVar1 = bind(uVar3,&sStack_1f0,0x10);
    if (iVar1 != 0) goto LAB_00189a12;
    pcStack_200 = (code *)0x189969;
    uVar4 = uv_default_loop();
    pcStack_200 = (code *)0x189976;
    iVar1 = uv_udp_init(uVar4,auStack_1e0);
    if (iVar1 != 0) goto LAB_00189a17;
    pcStack_200 = (code *)0x18998a;
    iVar1 = uv_udp_open(auStack_1e0,uVar3);
    if (iVar1 != 0) goto LAB_00189a1c;
    pcStack_200 = (code *)0x1899aa;
    iVar1 = uv_udp_recv_start(auStack_1e0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189a21;
    pcStack_200 = (code *)0x1899ba;
    uv_close(auStack_1e0,0);
    pcStack_200 = (code *)0x1899bf;
    uVar4 = uv_default_loop();
    pcStack_200 = (code *)0x1899c9;
    uv_run(uVar4,0);
    pcStack_200 = (code *)0x1899ce;
    uVar5 = uv_default_loop();
    pcStack_200 = (code *)0x1899e2;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_200 = (code *)0x1899ec;
    uv_run(uVar5,0);
    pcStack_200 = (code *)0x1899f1;
    uVar4 = uv_default_loop();
    pcStack_200 = (code *)0x1899f9;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_200 = (code *)0x189a02;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_200 = (code *)0x189a12;
    run_test_udp_open_bound_cold_1();
LAB_00189a12:
    pcStack_200 = (code *)0x189a17;
    run_test_udp_open_bound_cold_2();
LAB_00189a17:
    pcStack_200 = (code *)0x189a1c;
    run_test_udp_open_bound_cold_3();
LAB_00189a1c:
    pcStack_200 = (code *)0x189a21;
    run_test_udp_open_bound_cold_4();
LAB_00189a21:
    pcStack_200 = (code *)0x189a26;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_200 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3d8 = (code *)0x189a44;
  pcStack_200 = (code *)uVar5;
  auStack_3d0 = uv_buf_init("PING",4);
  pcStack_3d8 = (code *)0x189a63;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3c0);
  if (iVar1 == 0) {
    pcStack_3d8 = (code *)0x189a70;
    uVar3 = create_udp_socket();
    uVar5 = (ulong)uVar3;
    pcStack_3d8 = (code *)0x189a77;
    uVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x189a84;
    iVar1 = uv_udp_init(uVar4,auStack_3b0);
    if (iVar1 != 0) goto LAB_00189bb9;
    pcStack_3d8 = (code *)0x189a9d;
    iVar1 = connect(uVar3,&sStack_3c0,0x10);
    if (iVar1 != 0) goto LAB_00189bbe;
    pcStack_3d8 = (code *)0x189ab1;
    iVar1 = uv_udp_open(auStack_3b0,uVar3);
    if (iVar1 != 0) goto LAB_00189bc3;
    pcStack_3d8 = (code *)0x189abe;
    uVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x189ace;
    iVar1 = uv_udp_init(uVar4,auStack_2d8);
    if (iVar1 != 0) goto LAB_00189bc8;
    pcStack_3d8 = (code *)0x189aea;
    iVar1 = uv_udp_bind(auStack_2d8,&sStack_3c0,0);
    if (iVar1 != 0) goto LAB_00189bcd;
    pcStack_3d8 = (code *)0x189b0d;
    iVar1 = uv_udp_recv_start(auStack_2d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189bd2;
    pcStack_3d8 = (code *)0x189b38;
    iVar1 = uv_udp_send(&send_req,auStack_3b0,auStack_3d0,1,0,send_cb);
    if (iVar1 != 0) goto LAB_00189bd7;
    pcStack_3d8 = (code *)0x189b45;
    uVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x189b4f;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_00189bdc;
    if (close_cb_called != 2) goto LAB_00189be1;
    if (lStack_350 != 0) goto LAB_00189be6;
    pcStack_3d8 = (code *)0x189b75;
    uVar5 = uv_default_loop();
    pcStack_3d8 = (code *)0x189b89;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_3d8 = (code *)0x189b93;
    uv_run(uVar5,0);
    pcStack_3d8 = (code *)0x189b98;
    uVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x189ba0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_3d8 = (code *)0x189ba9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_3d8 = (code *)0x189bb9;
    run_test_udp_open_connect_cold_1();
LAB_00189bb9:
    pcStack_3d8 = (code *)0x189bbe;
    run_test_udp_open_connect_cold_2();
LAB_00189bbe:
    pcStack_3d8 = (code *)0x189bc3;
    run_test_udp_open_connect_cold_3();
LAB_00189bc3:
    pcStack_3d8 = (code *)0x189bc8;
    run_test_udp_open_connect_cold_4();
LAB_00189bc8:
    pcStack_3d8 = (code *)0x189bcd;
    run_test_udp_open_connect_cold_5();
LAB_00189bcd:
    pcStack_3d8 = (code *)0x189bd2;
    run_test_udp_open_connect_cold_6();
LAB_00189bd2:
    pcStack_3d8 = (code *)0x189bd7;
    run_test_udp_open_connect_cold_7();
LAB_00189bd7:
    pcStack_3d8 = (code *)0x189bdc;
    run_test_udp_open_connect_cold_8();
LAB_00189bdc:
    pcStack_3d8 = (code *)0x189be1;
    run_test_udp_open_connect_cold_9();
LAB_00189be1:
    pcStack_3d8 = (code *)0x189be6;
    run_test_udp_open_connect_cold_10();
LAB_00189be6:
    pcStack_3d8 = (code *)0x189beb;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3d8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_3e0 = uVar5;
  pcStack_3d8 = (code *)(ulong)uVar2;
  auStack_678 = uv_buf_init("PING",4);
  puVar6 = (undefined1 *)uv_default_loop();
  uStack_655 = 0;
  uStack_650 = 0;
  uStack_648 = 0;
  uStack_640 = 0;
  uStack_638 = 0;
  uStack_630 = 0;
  uStack_628 = 0;
  uStack_620 = 0;
  uStack_618 = 0;
  uStack_610 = 0;
  uStack_60a = 0;
  uStack_608 = 0;
  uStack_602 = 0;
  sStack_668.sa_family = 1;
  builtin_strncpy(sStack_668.sa_data,"/tmp/uv-test-s",0xe);
  uStack_658 = 0x636f;
  uStack_656 = 0x6b;
  puVar7 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00189d89:
    run_test_udp_send_unix_cold_2();
LAB_00189d8e:
    run_test_udp_send_unix_cold_3();
LAB_00189d93:
    run_test_udp_send_unix_cold_4();
LAB_00189d98:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar7 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,&sStack_668,0x6e);
    if (iVar1 != 0) goto LAB_00189d89;
    puVar7 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00189d8e;
    puVar7 = puVar6;
    iVar1 = uv_udp_init(puVar6,auStack_5f8);
    if (iVar1 != 0) goto LAB_00189d93;
    puVar7 = auStack_5f8;
    iVar1 = uv_udp_open(puVar7,uVar2);
    if (iVar1 != 0) goto LAB_00189d98;
    uv_run(puVar6,0);
    puVar7 = auStack_520;
    iVar1 = uv_udp_send(puVar7,auStack_5f8,auStack_678,1,&sStack_668,0);
    if (iVar1 == 0) {
      uv_close(auStack_5f8,0);
      uv_run(puVar6,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar7 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00189da2;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00189da2:
  run_test_udp_send_unix_cold_7();
  if (puVar7 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar7,0);
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT_LE(suggested_size, sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
  alloc_cb_called++;
}